

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Vec<float,_3UL> *v)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  char cStack_51;
  ostream *poStack_50;
  undefined8 uStack_48;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  poVar1 = std::ostream::_M_insert<double>((double)v->data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)v->data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(os,v->data[2]);
  lVar3 = 0x5d;
  std::operator<<(poVar1,']');
  uStack_48 = 2;
  cStack_51 = '[';
  poStack_50 = os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&cStack_51,1);
  lVar4 = 0;
  do {
    poVar2 = std::ostream::_M_insert<double>((double)*(float *)(lVar3 + lVar4 * 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(lVar3 + 0xc));
  std::operator<<(poVar1,']');
  if ((ulong)poVar1 >> 0x3d != 0) {
    std::__throw_bad_array_new_length();
  }
  std::__throw_bad_alloc();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }